

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_2x2_pack8.h
# Opt level: O3

void ncnn::conv2x2s1_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  float *pfVar29;
  float *pfVar30;
  float *pfVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  int iVar76;
  uint uVar77;
  int iVar78;
  uint uVar79;
  void *pvVar80;
  float fVar81;
  float fVar82;
  int iVar83;
  ulong uVar84;
  ulong uVar85;
  undefined1 (*pauVar86) [32];
  undefined1 (*pauVar87) [32];
  float *pfVar88;
  int iVar89;
  ulong uVar90;
  float *pfVar91;
  float *pfVar92;
  uint uVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  float fVar99;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  
  iVar76 = top_blob->c;
  if (0 < (long)iVar76) {
    uVar77 = top_blob->w;
    iVar78 = top_blob->h;
    uVar79 = bottom_blob->c;
    lVar95 = 0;
    do {
      uVar90 = (long)top_blob->h * (long)top_blob->w;
      uVar85 = top_blob->elemsize;
      uVar84 = (uVar85 * uVar90 + 0xf & 0xfffffffffffffff0) / uVar85;
      if (top_blob->dims == 4) {
        uVar84 = uVar90;
      }
      if (_bias == (Mat *)0x0) {
        auVar98 = ZEXT1632(ZEXT816(0) << 0x40);
      }
      else {
        auVar98 = *(undefined1 (*) [32])(&_bias->data + lVar95 * 4);
      }
      pauVar86 = (undefined1 (*) [32])(top_blob->cstep * lVar95 * uVar85 + (long)top_blob->data);
      iVar83 = (int)uVar84 * top_blob->d;
      pauVar87 = pauVar86;
      if (0 < iVar83) {
        do {
          *pauVar87 = auVar98;
          pauVar87 = pauVar87 + 1;
          iVar83 = iVar83 + -1;
        } while (iVar83 != 0);
      }
      if (0 < (int)uVar79) {
        uVar85 = 0;
        do {
          if (0 < iVar78) {
            lVar94 = kernel->cstep * lVar95 * kernel->elemsize;
            pvVar80 = kernel->data;
            lVar96 = (long)kernel->w * uVar85 * kernel->elemsize;
            pfVar88 = (float *)(bottom_blob->cstep * uVar85 * bottom_blob->elemsize +
                               (long)bottom_blob->data);
            pfVar91 = (float *)((long)bottom_blob->w * bottom_blob->elemsize + (long)pfVar88);
            iVar83 = 0;
            pauVar87 = pauVar86;
            do {
              if ((int)uVar77 < 2) {
                uVar93 = 0;
              }
              else {
                iVar89 = 1;
                do {
                  fVar32 = *pfVar88;
                  fVar33 = pfVar88[1];
                  fVar34 = pfVar88[2];
                  fVar35 = pfVar88[3];
                  fVar36 = pfVar88[4];
                  fVar37 = pfVar88[5];
                  fVar38 = pfVar88[6];
                  pfVar92 = (float *)((long)pvVar80 + lVar96 + lVar94);
                  pfVar1 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x20);
                  fVar39 = pfVar88[7];
                  pfVar2 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x40);
                  fVar81 = pfVar2[7];
                  pfVar3 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x60);
                  pfVar4 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x80);
                  pfVar5 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0xa0);
                  fVar106 = fVar33 + fVar34 + fVar34;
                  pfVar6 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0xc0);
                  pfVar7 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0xe0);
                  fVar104 = fVar32 + *(float *)((long)*pauVar87 + 0x1c) + fVar34;
                  fVar40 = pfVar88[8];
                  fVar41 = pfVar88[9];
                  fVar42 = pfVar88[10];
                  fVar43 = pfVar88[0xb];
                  fVar44 = pfVar88[0xc];
                  fVar45 = pfVar88[0xd];
                  fVar99 = pfVar92[7] + *(float *)(pauVar87[1] + 0x1c);
                  fVar46 = pfVar88[0xe];
                  fVar47 = pfVar88[0xf];
                  pfVar8 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x100);
                  pfVar9 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x120);
                  pfVar10 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x140);
                  fVar48 = pfVar88[0x10];
                  pfVar11 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x160);
                  fVar49 = pfVar88[0x11];
                  pfVar12 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x180);
                  pfVar13 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x1a0);
                  pfVar14 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x1c0);
                  fVar50 = pfVar88[0x12];
                  fVar51 = pfVar88[0x13];
                  fVar52 = pfVar88[0x14];
                  fVar53 = pfVar88[0x15];
                  pfVar15 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x1e0);
                  fVar54 = pfVar88[0x16];
                  fVar55 = pfVar88[0x17];
                  fVar56 = *pfVar91;
                  fVar57 = pfVar91[1];
                  fVar107 = fVar51 + fVar49 + pfVar1[7] + fVar81 + fVar81 + fVar99 + pfVar7[7] +
                            fVar47;
                  fVar58 = pfVar91[2];
                  fVar59 = pfVar91[3];
                  fVar60 = pfVar91[4];
                  fVar111 = pfVar12[7] + fVar106 + fVar34 + fVar104 + fVar40 + fVar43 + fVar45;
                  fVar61 = pfVar91[5];
                  pfVar16 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x200);
                  pfVar17 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x220);
                  fVar82 = pfVar17[7];
                  pfVar18 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x240);
                  pfVar19 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x260);
                  fVar108 = fVar104 + fVar106 + pfVar6[7] + fVar42 + fVar44 + fVar46 + fVar107;
                  pfVar20 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x280);
                  pfVar21 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x2a0);
                  pfVar22 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x2c0);
                  fVar104 = pfVar91[6];
                  fVar106 = pfVar91[7];
                  pfVar23 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x2e0);
                  fVar101 = pfVar91[8];
                  fVar102 = pfVar91[9];
                  fVar103 = pfVar91[10];
                  fVar105 = fVar107 + fVar46 + fVar82;
                  fVar107 = pfVar91[0xb];
                  fVar62 = pfVar91[0xc];
                  fVar63 = pfVar91[0xd];
                  fVar64 = pfVar91[0xe];
                  fVar65 = pfVar91[0xf];
                  pfVar24 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x300);
                  pfVar25 = (float *)((long)pvVar80 + lVar96 + lVar94 + 800);
                  pfVar26 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x340);
                  fVar109 = fVar111 + fVar56 + fVar108 + fVar111 + fVar106 + pfVar22[7];
                  auVar98 = *(undefined1 (*) [32])((long)pvVar80 + lVar96 + lVar94 + 0x360);
                  fVar110 = fVar104 + fVar60 + fVar108 + fVar58 + fVar82 + fVar103;
                  auVar72 = *(undefined1 (*) [32])((long)pvVar80 + lVar96 + lVar94 + 0x380);
                  auVar73 = *(undefined1 (*) [32])((long)pvVar80 + lVar96 + lVar94 + 0x3a0);
                  auVar74 = *(undefined1 (*) [32])((long)pvVar80 + lVar96 + lVar94 + 0x3c0);
                  auVar75 = *(undefined1 (*) [32])((long)pvVar80 + lVar96 + lVar94 + 0x3e0);
                  fVar108 = pfVar91[0x10];
                  fVar111 = pfVar91[0x11];
                  fVar66 = pfVar91[0x12];
                  fVar67 = pfVar91[0x13];
                  fVar68 = pfVar91[0x14];
                  fVar69 = pfVar91[0x15];
                  fVar70 = pfVar91[0x16];
                  fVar71 = pfVar91[0x17];
                  auVar100._0_4_ =
                       fVar104 * *pfVar22 +
                       *pfVar20 * fVar60 +
                       *pfVar92 * fVar32 + *(float *)*pauVar87 + *pfVar4 * fVar36 + fVar38 * *pfVar6
                       + *pfVar8 * fVar40 + *pfVar10 * fVar42 + *pfVar12 * fVar44 +
                       *pfVar14 * fVar46 + fVar56 * *pfVar16 + *pfVar18 * fVar58 +
                       fVar101 * *pfVar24 + *pfVar26 * fVar103 + fVar62 * auVar72._0_4_ +
                       auVar74._0_4_ * fVar64 +
                       auVar75._0_4_ * fVar65 +
                       fVar63 * auVar73._0_4_ +
                       *pfVar15 * fVar47 +
                       *pfVar1 * fVar33 + *pfVar2 * fVar34 + *pfVar3 * fVar35 + *pfVar5 * fVar37 +
                       fVar39 * *pfVar7 + *pfVar9 * fVar41 + *pfVar11 * fVar43 + *pfVar13 * fVar45 +
                       fVar57 * *pfVar17 + *pfVar19 * fVar59 + *pfVar21 * fVar61 +
                       *pfVar23 * fVar106 + fVar102 * *pfVar25 + auVar98._0_4_ * fVar107;
                  auVar100._4_4_ =
                       fVar104 * pfVar22[1] +
                       pfVar20[1] * fVar60 +
                       pfVar92[1] * fVar32 + *(float *)((long)*pauVar87 + 4) + pfVar4[1] * fVar36 +
                       fVar38 * pfVar6[1] + pfVar8[1] * fVar40 + pfVar10[1] * fVar42 +
                       pfVar12[1] * fVar44 + pfVar14[1] * fVar46 + fVar56 * pfVar16[1] +
                       pfVar18[1] * fVar58 + fVar101 * pfVar24[1] + pfVar26[1] * fVar103 +
                       fVar62 * auVar72._4_4_ + auVar74._4_4_ * fVar64 +
                       auVar75._4_4_ * fVar65 +
                       fVar63 * auVar73._4_4_ +
                       pfVar15[1] * fVar47 +
                       pfVar1[1] * fVar33 + pfVar2[1] * fVar34 + pfVar3[1] * fVar35 +
                       pfVar5[1] * fVar37 + fVar39 * pfVar7[1] + pfVar9[1] * fVar41 +
                       pfVar11[1] * fVar43 + pfVar13[1] * fVar45 + fVar57 * pfVar17[1] +
                       pfVar19[1] * fVar59 + pfVar21[1] * fVar61 + pfVar23[1] * fVar106 +
                       fVar102 * pfVar25[1] + auVar98._4_4_ * fVar107;
                  auVar100._8_4_ =
                       fVar104 * pfVar22[2] +
                       pfVar20[2] * fVar60 +
                       pfVar92[2] * fVar32 + *(float *)((long)*pauVar87 + 8) + pfVar4[2] * fVar36 +
                       fVar38 * pfVar6[2] + pfVar8[2] * fVar40 + pfVar10[2] * fVar42 +
                       pfVar12[2] * fVar44 + pfVar14[2] * fVar46 + fVar56 * pfVar16[2] +
                       pfVar18[2] * fVar58 + fVar101 * pfVar24[2] + pfVar26[2] * fVar103 +
                       fVar62 * auVar72._8_4_ + auVar74._8_4_ * fVar64 +
                       auVar75._8_4_ * fVar65 +
                       fVar63 * auVar73._8_4_ +
                       pfVar15[2] * fVar47 +
                       pfVar1[2] * fVar33 + pfVar2[2] * fVar34 + pfVar3[2] * fVar35 +
                       pfVar5[2] * fVar37 + fVar39 * pfVar7[2] + pfVar9[2] * fVar41 +
                       pfVar11[2] * fVar43 + pfVar13[2] * fVar45 + fVar57 * pfVar17[2] +
                       pfVar19[2] * fVar59 + pfVar21[2] * fVar61 + pfVar23[2] * fVar106 +
                       fVar102 * pfVar25[2] + auVar98._8_4_ * fVar107;
                  auVar100._12_4_ =
                       fVar104 * pfVar22[3] +
                       pfVar20[3] * fVar60 +
                       pfVar92[3] * fVar32 + *(float *)((long)*pauVar87 + 0xc) + pfVar4[3] * fVar36
                       + fVar38 * pfVar6[3] + pfVar8[3] * fVar40 + pfVar10[3] * fVar42 +
                       pfVar12[3] * fVar44 + pfVar14[3] * fVar46 + fVar56 * pfVar16[3] +
                       pfVar18[3] * fVar58 + fVar101 * pfVar24[3] + pfVar26[3] * fVar103 +
                       fVar62 * auVar72._12_4_ + auVar74._12_4_ * fVar64 +
                       auVar75._12_4_ * fVar65 +
                       fVar63 * auVar73._12_4_ +
                       pfVar15[3] * fVar47 +
                       pfVar1[3] * fVar33 + pfVar2[3] * fVar34 + pfVar3[3] * fVar35 +
                       pfVar5[3] * fVar37 + fVar39 * pfVar7[3] + pfVar9[3] * fVar41 +
                       pfVar11[3] * fVar43 + pfVar13[3] * fVar45 + fVar57 * pfVar17[3] +
                       pfVar19[3] * fVar59 + pfVar21[3] * fVar61 + pfVar23[3] * fVar106 +
                       fVar102 * pfVar25[3] + auVar98._12_4_ * fVar107;
                  auVar100._16_4_ =
                       fVar104 * pfVar22[4] +
                       pfVar20[4] * fVar60 +
                       pfVar92[4] * fVar32 + *(float *)((long)*pauVar87 + 0x10) + pfVar4[4] * fVar36
                       + fVar38 * pfVar6[4] + pfVar8[4] * fVar40 + pfVar10[4] * fVar42 +
                       pfVar12[4] * fVar44 + pfVar14[4] * fVar46 + fVar56 * pfVar16[4] +
                       pfVar18[4] * fVar58 + fVar101 * pfVar24[4] + pfVar26[4] * fVar103 +
                       fVar62 * auVar72._16_4_ + auVar74._16_4_ * fVar64 +
                       auVar75._16_4_ * fVar65 +
                       fVar63 * auVar73._16_4_ +
                       pfVar15[4] * fVar47 +
                       pfVar1[4] * fVar33 + pfVar2[4] * fVar34 + pfVar3[4] * fVar35 +
                       pfVar5[4] * fVar37 + fVar39 * pfVar7[4] + pfVar9[4] * fVar41 +
                       pfVar11[4] * fVar43 + pfVar13[4] * fVar45 + fVar57 * pfVar17[4] +
                       pfVar19[4] * fVar59 + pfVar21[4] * fVar61 + pfVar23[4] * fVar106 +
                       fVar102 * pfVar25[4] + auVar98._16_4_ * fVar107;
                  auVar100._20_4_ =
                       fVar104 * pfVar22[5] +
                       pfVar20[5] * fVar60 +
                       pfVar92[5] * fVar32 + *(float *)((long)*pauVar87 + 0x14) + pfVar4[5] * fVar36
                       + fVar38 * pfVar6[5] + pfVar8[5] * fVar40 + pfVar10[5] * fVar42 +
                       pfVar12[5] * fVar44 + pfVar14[5] * fVar46 + fVar56 * pfVar16[5] +
                       pfVar18[5] * fVar58 + fVar101 * pfVar24[5] + pfVar26[5] * fVar103 +
                       fVar62 * auVar72._20_4_ + auVar74._20_4_ * fVar64 +
                       auVar75._20_4_ * fVar65 +
                       fVar63 * auVar73._20_4_ +
                       pfVar15[5] * fVar47 +
                       pfVar1[5] * fVar33 + pfVar2[5] * fVar34 + pfVar3[5] * fVar35 +
                       pfVar5[5] * fVar37 + fVar39 * pfVar7[5] + pfVar9[5] * fVar41 +
                       pfVar11[5] * fVar43 + pfVar13[5] * fVar45 + fVar57 * pfVar17[5] +
                       pfVar19[5] * fVar59 + pfVar21[5] * fVar61 + pfVar23[5] * fVar106 +
                       fVar102 * pfVar25[5] + auVar98._20_4_ * fVar107;
                  auVar100._24_4_ =
                       fVar104 * pfVar22[6] +
                       pfVar20[6] * fVar60 +
                       pfVar92[6] * fVar32 + *(float *)((long)*pauVar87 + 0x18) + pfVar4[6] * fVar36
                       + fVar38 * pfVar6[6] + pfVar8[6] * fVar40 + pfVar10[6] * fVar42 +
                       pfVar12[6] * fVar44 + pfVar14[6] * fVar46 + fVar56 * pfVar16[6] +
                       pfVar18[6] * fVar58 + fVar101 * pfVar24[6] + pfVar26[6] * fVar103 +
                       fVar62 * auVar72._24_4_ + auVar74._24_4_ * fVar64 +
                       auVar75._24_4_ * fVar65 +
                       fVar63 * auVar73._24_4_ +
                       pfVar15[6] * fVar47 +
                       pfVar1[6] * fVar33 + pfVar2[6] * fVar34 + pfVar3[6] * fVar35 +
                       pfVar5[6] * fVar37 + fVar39 * pfVar7[6] + pfVar9[6] * fVar41 +
                       pfVar11[6] * fVar43 + pfVar13[6] * fVar45 + fVar57 * pfVar17[6] +
                       pfVar19[6] * fVar59 + pfVar21[6] * fVar61 + pfVar23[6] * fVar106 +
                       fVar102 * pfVar25[6] + auVar98._24_4_ * fVar107;
                  auVar100._28_4_ =
                       fVar110 + fVar109 + fVar64 + fVar65 + fVar110 + fVar109 + fVar107;
                  auVar97._0_4_ =
                       fVar108 * *pfVar24 +
                       fVar52 * *pfVar12 +
                       fVar40 * *pfVar92 + *(float *)pauVar87[1] + *pfVar4 * fVar44 +
                       fVar46 * *pfVar6 + fVar48 * *pfVar8 + fVar50 * *pfVar10 + fVar54 * *pfVar14 +
                       fVar101 * *pfVar16 + fVar103 * *pfVar18 + fVar62 * *pfVar20 +
                       fVar64 * *pfVar22 + fVar66 * *pfVar26 + fVar68 * auVar72._0_4_ +
                       auVar74._0_4_ * fVar70 +
                       fVar51 * *pfVar11 +
                       fVar49 * *pfVar9 +
                       fVar41 * *pfVar1 + fVar42 * *pfVar2 + *pfVar3 * fVar43 + *pfVar5 * fVar45 +
                       fVar47 * *pfVar7 + fVar53 * *pfVar13 + fVar55 * *pfVar15 + fVar102 * *pfVar17
                       + *pfVar19 * fVar107 + fVar63 * *pfVar21 + fVar65 * *pfVar23 +
                       fVar111 * *pfVar25 + fVar67 * auVar98._0_4_ + fVar69 * auVar73._0_4_ +
                       auVar75._0_4_ * fVar71;
                  auVar97._4_4_ =
                       fVar108 * pfVar24[1] +
                       fVar52 * pfVar12[1] +
                       fVar40 * pfVar92[1] + *(float *)(pauVar87[1] + 4) + pfVar4[1] * fVar44 +
                       fVar46 * pfVar6[1] + fVar48 * pfVar8[1] + fVar50 * pfVar10[1] +
                       fVar54 * pfVar14[1] + fVar101 * pfVar16[1] + fVar103 * pfVar18[1] +
                       fVar62 * pfVar20[1] + fVar64 * pfVar22[1] + fVar66 * pfVar26[1] +
                       fVar68 * auVar72._4_4_ + auVar74._4_4_ * fVar70 +
                       fVar51 * pfVar11[1] +
                       fVar49 * pfVar9[1] +
                       fVar41 * pfVar1[1] + fVar42 * pfVar2[1] + pfVar3[1] * fVar43 +
                       pfVar5[1] * fVar45 + fVar47 * pfVar7[1] + fVar53 * pfVar13[1] +
                       fVar55 * pfVar15[1] + fVar102 * pfVar17[1] + pfVar19[1] * fVar107 +
                       fVar63 * pfVar21[1] + fVar65 * pfVar23[1] + fVar111 * pfVar25[1] +
                       fVar67 * auVar98._4_4_ + fVar69 * auVar73._4_4_ + auVar75._4_4_ * fVar71;
                  auVar97._8_4_ =
                       fVar108 * pfVar24[2] +
                       fVar52 * pfVar12[2] +
                       fVar40 * pfVar92[2] + *(float *)(pauVar87[1] + 8) + pfVar4[2] * fVar44 +
                       fVar46 * pfVar6[2] + fVar48 * pfVar8[2] + fVar50 * pfVar10[2] +
                       fVar54 * pfVar14[2] + fVar101 * pfVar16[2] + fVar103 * pfVar18[2] +
                       fVar62 * pfVar20[2] + fVar64 * pfVar22[2] + fVar66 * pfVar26[2] +
                       fVar68 * auVar72._8_4_ + auVar74._8_4_ * fVar70 +
                       fVar51 * pfVar11[2] +
                       fVar49 * pfVar9[2] +
                       fVar41 * pfVar1[2] + fVar42 * pfVar2[2] + pfVar3[2] * fVar43 +
                       pfVar5[2] * fVar45 + fVar47 * pfVar7[2] + fVar53 * pfVar13[2] +
                       fVar55 * pfVar15[2] + fVar102 * pfVar17[2] + pfVar19[2] * fVar107 +
                       fVar63 * pfVar21[2] + fVar65 * pfVar23[2] + fVar111 * pfVar25[2] +
                       fVar67 * auVar98._8_4_ + fVar69 * auVar73._8_4_ + auVar75._8_4_ * fVar71;
                  auVar97._12_4_ =
                       fVar108 * pfVar24[3] +
                       fVar52 * pfVar12[3] +
                       fVar40 * pfVar92[3] + *(float *)(pauVar87[1] + 0xc) + pfVar4[3] * fVar44 +
                       fVar46 * pfVar6[3] + fVar48 * pfVar8[3] + fVar50 * pfVar10[3] +
                       fVar54 * pfVar14[3] + fVar101 * pfVar16[3] + fVar103 * pfVar18[3] +
                       fVar62 * pfVar20[3] + fVar64 * pfVar22[3] + fVar66 * pfVar26[3] +
                       fVar68 * auVar72._12_4_ + auVar74._12_4_ * fVar70 +
                       fVar51 * pfVar11[3] +
                       fVar49 * pfVar9[3] +
                       fVar41 * pfVar1[3] + fVar42 * pfVar2[3] + pfVar3[3] * fVar43 +
                       pfVar5[3] * fVar45 + fVar47 * pfVar7[3] + fVar53 * pfVar13[3] +
                       fVar55 * pfVar15[3] + fVar102 * pfVar17[3] + pfVar19[3] * fVar107 +
                       fVar63 * pfVar21[3] + fVar65 * pfVar23[3] + fVar111 * pfVar25[3] +
                       fVar67 * auVar98._12_4_ + fVar69 * auVar73._12_4_ + auVar75._12_4_ * fVar71;
                  auVar97._16_4_ =
                       fVar108 * pfVar24[4] +
                       fVar52 * pfVar12[4] +
                       fVar40 * pfVar92[4] + *(float *)(pauVar87[1] + 0x10) + pfVar4[4] * fVar44 +
                       fVar46 * pfVar6[4] + fVar48 * pfVar8[4] + fVar50 * pfVar10[4] +
                       fVar54 * pfVar14[4] + fVar101 * pfVar16[4] + fVar103 * pfVar18[4] +
                       fVar62 * pfVar20[4] + fVar64 * pfVar22[4] + fVar66 * pfVar26[4] +
                       fVar68 * auVar72._16_4_ + auVar74._16_4_ * fVar70 +
                       fVar51 * pfVar11[4] +
                       fVar49 * pfVar9[4] +
                       fVar41 * pfVar1[4] + fVar42 * pfVar2[4] + pfVar3[4] * fVar43 +
                       pfVar5[4] * fVar45 + fVar47 * pfVar7[4] + fVar53 * pfVar13[4] +
                       fVar55 * pfVar15[4] + fVar102 * pfVar17[4] + pfVar19[4] * fVar107 +
                       fVar63 * pfVar21[4] + fVar65 * pfVar23[4] + fVar111 * pfVar25[4] +
                       fVar67 * auVar98._16_4_ + fVar69 * auVar73._16_4_ + auVar75._16_4_ * fVar71;
                  auVar97._20_4_ =
                       fVar108 * pfVar24[5] +
                       fVar52 * pfVar12[5] +
                       fVar40 * pfVar92[5] + *(float *)(pauVar87[1] + 0x14) + pfVar4[5] * fVar44 +
                       fVar46 * pfVar6[5] + fVar48 * pfVar8[5] + fVar50 * pfVar10[5] +
                       fVar54 * pfVar14[5] + fVar101 * pfVar16[5] + fVar103 * pfVar18[5] +
                       fVar62 * pfVar20[5] + fVar64 * pfVar22[5] + fVar66 * pfVar26[5] +
                       fVar68 * auVar72._20_4_ + auVar74._20_4_ * fVar70 +
                       fVar51 * pfVar11[5] +
                       fVar49 * pfVar9[5] +
                       fVar41 * pfVar1[5] + fVar42 * pfVar2[5] + pfVar3[5] * fVar43 +
                       pfVar5[5] * fVar45 + fVar47 * pfVar7[5] + fVar53 * pfVar13[5] +
                       fVar55 * pfVar15[5] + fVar102 * pfVar17[5] + pfVar19[5] * fVar107 +
                       fVar63 * pfVar21[5] + fVar65 * pfVar23[5] + fVar111 * pfVar25[5] +
                       fVar67 * auVar98._20_4_ + fVar69 * auVar73._20_4_ + auVar75._20_4_ * fVar71;
                  auVar97._24_4_ =
                       fVar108 * pfVar24[6] +
                       fVar52 * pfVar12[6] +
                       fVar40 * pfVar92[6] + *(float *)(pauVar87[1] + 0x18) + pfVar4[6] * fVar44 +
                       fVar46 * pfVar6[6] + fVar48 * pfVar8[6] + fVar50 * pfVar10[6] +
                       fVar54 * pfVar14[6] + fVar101 * pfVar16[6] + fVar103 * pfVar18[6] +
                       fVar62 * pfVar20[6] + fVar64 * pfVar22[6] + fVar66 * pfVar26[6] +
                       fVar68 * auVar72._24_4_ + auVar74._24_4_ * fVar70 +
                       fVar51 * pfVar11[6] +
                       fVar49 * pfVar9[6] +
                       fVar41 * pfVar1[6] + fVar42 * pfVar2[6] + pfVar3[6] * fVar43 +
                       pfVar5[6] * fVar45 + fVar47 * pfVar7[6] + fVar53 * pfVar13[6] +
                       fVar55 * pfVar15[6] + fVar102 * pfVar17[6] + pfVar19[6] * fVar107 +
                       fVar63 * pfVar21[6] + fVar65 * pfVar23[6] + fVar111 * pfVar25[6] +
                       fVar67 * auVar98._24_4_ + fVar69 * auVar73._24_4_ + auVar75._24_4_ * fVar71;
                  auVar97._28_4_ =
                       fVar108 + fVar52 + fVar99 + fVar81 + pfVar6[7] + fVar48 + pfVar10[7] + fVar47
                                 + pfVar16[7] + pfVar18[7] + fVar105 + fVar82 + fVar66 + fVar66 +
                       fVar66 + fVar105 + pfVar18[7] + fVar82 + fVar82 + pfVar25[7] + fVar66 +
                                fVar66 + fVar66;
                  *pauVar87 = auVar100;
                  pauVar87[1] = auVar97;
                  pfVar88 = pfVar88 + 0x10;
                  pfVar91 = pfVar91 + 0x10;
                  pauVar87 = pauVar87 + 2;
                  iVar89 = iVar89 + 2;
                  uVar93 = uVar77 & 0xfffffffe;
                } while (iVar89 < (int)uVar77);
              }
              iVar89 = uVar77 - uVar93;
              pfVar92 = pfVar91;
              if (iVar89 != 0 && (int)uVar93 <= (int)uVar77) {
                do {
                  fVar32 = *pfVar88;
                  fVar33 = pfVar88[1];
                  fVar34 = pfVar88[2];
                  fVar35 = pfVar88[3];
                  fVar36 = pfVar88[4];
                  fVar37 = pfVar88[5];
                  fVar38 = pfVar88[6];
                  fVar39 = pfVar88[7];
                  pfVar1 = (float *)((long)pvVar80 + lVar96 + lVar94);
                  pfVar2 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x20);
                  pfVar3 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x40);
                  pfVar4 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x60);
                  pfVar5 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x80);
                  pfVar6 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0xa0);
                  fVar101 = fVar33 + fVar34 + fVar34 + fVar35;
                  pfVar7 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0xc0);
                  pfVar8 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0xe0);
                  fVar40 = pfVar88[8];
                  fVar41 = pfVar88[9];
                  fVar42 = pfVar88[10];
                  fVar43 = pfVar88[0xb];
                  fVar44 = pfVar88[0xc];
                  fVar45 = pfVar88[0xd];
                  fVar46 = pfVar88[0xe];
                  fVar47 = pfVar88[0xf];
                  pfVar9 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x100);
                  pfVar10 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x120);
                  fVar102 = fVar34 + fVar101 + fVar40 + fVar41;
                  pfVar11 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x140);
                  pfVar12 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x160);
                  pfVar13 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x180);
                  pfVar14 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x1a0);
                  pfVar15 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x1c0);
                  fVar103 = fVar40 + fVar102 + fVar40 + fVar41 + fVar40;
                  pfVar16 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x1e0);
                  fVar48 = *pfVar92;
                  fVar49 = pfVar92[1];
                  fVar50 = pfVar92[2];
                  fVar51 = pfVar92[3];
                  fVar52 = pfVar92[4];
                  fVar53 = pfVar92[5];
                  fVar54 = pfVar92[6];
                  fVar55 = pfVar92[7];
                  pfVar88 = pfVar88 + 8;
                  pfVar17 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x200);
                  pfVar18 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x220);
                  pfVar19 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x240);
                  pfVar20 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x260);
                  pfVar21 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x280);
                  pfVar22 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x2a0);
                  pfVar23 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x2c0);
                  pfVar24 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x2e0);
                  pfVar91 = pfVar92 + 8;
                  fVar56 = pfVar92[8];
                  fVar57 = pfVar92[9];
                  fVar58 = pfVar92[10];
                  fVar59 = pfVar92[0xb];
                  fVar60 = pfVar92[0xc];
                  fVar61 = pfVar92[0xd];
                  fVar104 = pfVar92[0xe];
                  fVar106 = pfVar92[0xf];
                  pfVar92 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x300);
                  pfVar25 = (float *)((long)pvVar80 + lVar96 + lVar94 + 800);
                  pfVar26 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x340);
                  pfVar27 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x360);
                  fVar107 = fVar48 + fVar49 + fVar48 + fVar56 + fVar56 + fVar56 + fVar57;
                  pfVar28 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x380);
                  pfVar29 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x3a0);
                  pfVar30 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x3c0);
                  pfVar31 = (float *)((long)pvVar80 + lVar96 + lVar94 + 0x3e0);
                  auVar98._0_4_ =
                       fVar32 * *pfVar1 + *(float *)*pauVar87 + fVar33 * *pfVar2 + fVar34 * *pfVar3
                       + fVar35 * *pfVar4 + fVar36 * *pfVar5 + fVar37 * *pfVar6 +
                       fVar38 * *pfVar7 + fVar39 * *pfVar8 + fVar40 * *pfVar9 + fVar41 * *pfVar10 +
                       fVar42 * *pfVar11 + fVar43 * *pfVar12 + fVar44 * *pfVar13 + fVar45 * *pfVar14
                       + fVar46 * *pfVar15 +
                       fVar47 * *pfVar16 + fVar48 * *pfVar17 + fVar49 * *pfVar18 + fVar50 * *pfVar19
                       + fVar51 * *pfVar20 + fVar52 * *pfVar21 +
                       fVar53 * *pfVar22 + fVar54 * *pfVar23 + fVar55 * *pfVar24 + fVar56 * *pfVar92
                       + fVar57 * *pfVar25 + fVar58 * *pfVar26 + fVar59 * *pfVar27 +
                       fVar60 * *pfVar28 + fVar61 * *pfVar29 + fVar104 * *pfVar30 +
                       fVar106 * *pfVar31;
                  auVar98._4_4_ =
                       fVar32 * pfVar1[1] + *(float *)((long)*pauVar87 + 4) +
                       fVar33 * pfVar2[1] + fVar34 * pfVar3[1] +
                       fVar35 * pfVar4[1] + fVar36 * pfVar5[1] + fVar37 * pfVar6[1] +
                       fVar38 * pfVar7[1] + fVar39 * pfVar8[1] + fVar40 * pfVar9[1] +
                       fVar41 * pfVar10[1] +
                       fVar42 * pfVar11[1] + fVar43 * pfVar12[1] + fVar44 * pfVar13[1] +
                       fVar45 * pfVar14[1] + fVar46 * pfVar15[1] +
                       fVar47 * pfVar16[1] + fVar48 * pfVar17[1] + fVar49 * pfVar18[1] +
                       fVar50 * pfVar19[1] + fVar51 * pfVar20[1] + fVar52 * pfVar21[1] +
                       fVar53 * pfVar22[1] + fVar54 * pfVar23[1] + fVar55 * pfVar24[1] +
                       fVar56 * pfVar92[1] + fVar57 * pfVar25[1] + fVar58 * pfVar26[1] +
                       fVar59 * pfVar27[1] +
                       fVar60 * pfVar28[1] + fVar61 * pfVar29[1] + fVar104 * pfVar30[1] +
                       fVar106 * pfVar31[1];
                  auVar98._8_4_ =
                       fVar32 * pfVar1[2] + *(float *)((long)*pauVar87 + 8) +
                       fVar33 * pfVar2[2] + fVar34 * pfVar3[2] +
                       fVar35 * pfVar4[2] + fVar36 * pfVar5[2] + fVar37 * pfVar6[2] +
                       fVar38 * pfVar7[2] + fVar39 * pfVar8[2] + fVar40 * pfVar9[2] +
                       fVar41 * pfVar10[2] +
                       fVar42 * pfVar11[2] + fVar43 * pfVar12[2] + fVar44 * pfVar13[2] +
                       fVar45 * pfVar14[2] + fVar46 * pfVar15[2] +
                       fVar47 * pfVar16[2] + fVar48 * pfVar17[2] + fVar49 * pfVar18[2] +
                       fVar50 * pfVar19[2] + fVar51 * pfVar20[2] + fVar52 * pfVar21[2] +
                       fVar53 * pfVar22[2] + fVar54 * pfVar23[2] + fVar55 * pfVar24[2] +
                       fVar56 * pfVar92[2] + fVar57 * pfVar25[2] + fVar58 * pfVar26[2] +
                       fVar59 * pfVar27[2] +
                       fVar60 * pfVar28[2] + fVar61 * pfVar29[2] + fVar104 * pfVar30[2] +
                       fVar106 * pfVar31[2];
                  auVar98._12_4_ =
                       fVar32 * pfVar1[3] + *(float *)((long)*pauVar87 + 0xc) +
                       fVar33 * pfVar2[3] + fVar34 * pfVar3[3] +
                       fVar35 * pfVar4[3] + fVar36 * pfVar5[3] + fVar37 * pfVar6[3] +
                       fVar38 * pfVar7[3] + fVar39 * pfVar8[3] + fVar40 * pfVar9[3] +
                       fVar41 * pfVar10[3] +
                       fVar42 * pfVar11[3] + fVar43 * pfVar12[3] + fVar44 * pfVar13[3] +
                       fVar45 * pfVar14[3] + fVar46 * pfVar15[3] +
                       fVar47 * pfVar16[3] + fVar48 * pfVar17[3] + fVar49 * pfVar18[3] +
                       fVar50 * pfVar19[3] + fVar51 * pfVar20[3] + fVar52 * pfVar21[3] +
                       fVar53 * pfVar22[3] + fVar54 * pfVar23[3] + fVar55 * pfVar24[3] +
                       fVar56 * pfVar92[3] + fVar57 * pfVar25[3] + fVar58 * pfVar26[3] +
                       fVar59 * pfVar27[3] +
                       fVar60 * pfVar28[3] + fVar61 * pfVar29[3] + fVar104 * pfVar30[3] +
                       fVar106 * pfVar31[3];
                  auVar98._16_4_ =
                       fVar32 * pfVar1[4] + *(float *)((long)*pauVar87 + 0x10) +
                       fVar33 * pfVar2[4] + fVar34 * pfVar3[4] +
                       fVar35 * pfVar4[4] + fVar36 * pfVar5[4] + fVar37 * pfVar6[4] +
                       fVar38 * pfVar7[4] + fVar39 * pfVar8[4] + fVar40 * pfVar9[4] +
                       fVar41 * pfVar10[4] +
                       fVar42 * pfVar11[4] + fVar43 * pfVar12[4] + fVar44 * pfVar13[4] +
                       fVar45 * pfVar14[4] + fVar46 * pfVar15[4] +
                       fVar47 * pfVar16[4] + fVar48 * pfVar17[4] + fVar49 * pfVar18[4] +
                       fVar50 * pfVar19[4] + fVar51 * pfVar20[4] + fVar52 * pfVar21[4] +
                       fVar53 * pfVar22[4] + fVar54 * pfVar23[4] + fVar55 * pfVar24[4] +
                       fVar56 * pfVar92[4] + fVar57 * pfVar25[4] + fVar58 * pfVar26[4] +
                       fVar59 * pfVar27[4] +
                       fVar60 * pfVar28[4] + fVar61 * pfVar29[4] + fVar104 * pfVar30[4] +
                       fVar106 * pfVar31[4];
                  auVar98._20_4_ =
                       fVar32 * pfVar1[5] + *(float *)((long)*pauVar87 + 0x14) +
                       fVar33 * pfVar2[5] + fVar34 * pfVar3[5] +
                       fVar35 * pfVar4[5] + fVar36 * pfVar5[5] + fVar37 * pfVar6[5] +
                       fVar38 * pfVar7[5] + fVar39 * pfVar8[5] + fVar40 * pfVar9[5] +
                       fVar41 * pfVar10[5] +
                       fVar42 * pfVar11[5] + fVar43 * pfVar12[5] + fVar44 * pfVar13[5] +
                       fVar45 * pfVar14[5] + fVar46 * pfVar15[5] +
                       fVar47 * pfVar16[5] + fVar48 * pfVar17[5] + fVar49 * pfVar18[5] +
                       fVar50 * pfVar19[5] + fVar51 * pfVar20[5] + fVar52 * pfVar21[5] +
                       fVar53 * pfVar22[5] + fVar54 * pfVar23[5] + fVar55 * pfVar24[5] +
                       fVar56 * pfVar92[5] + fVar57 * pfVar25[5] + fVar58 * pfVar26[5] +
                       fVar59 * pfVar27[5] +
                       fVar60 * pfVar28[5] + fVar61 * pfVar29[5] + fVar104 * pfVar30[5] +
                       fVar106 * pfVar31[5];
                  auVar98._24_4_ =
                       fVar32 * pfVar1[6] + *(float *)((long)*pauVar87 + 0x18) +
                       fVar33 * pfVar2[6] + fVar34 * pfVar3[6] +
                       fVar35 * pfVar4[6] + fVar36 * pfVar5[6] + fVar37 * pfVar6[6] +
                       fVar38 * pfVar7[6] + fVar39 * pfVar8[6] + fVar40 * pfVar9[6] +
                       fVar41 * pfVar10[6] +
                       fVar42 * pfVar11[6] + fVar43 * pfVar12[6] + fVar44 * pfVar13[6] +
                       fVar45 * pfVar14[6] + fVar46 * pfVar15[6] +
                       fVar47 * pfVar16[6] + fVar48 * pfVar17[6] + fVar49 * pfVar18[6] +
                       fVar50 * pfVar19[6] + fVar51 * pfVar20[6] + fVar52 * pfVar21[6] +
                       fVar53 * pfVar22[6] + fVar54 * pfVar23[6] + fVar55 * pfVar24[6] +
                       fVar56 * pfVar92[6] + fVar57 * pfVar25[6] + fVar58 * pfVar26[6] +
                       fVar59 * pfVar27[6] +
                       fVar60 * pfVar28[6] + fVar61 * pfVar29[6] + fVar104 * pfVar30[6] +
                       fVar106 * pfVar31[6];
                  auVar98._28_4_ =
                       fVar32 + *(float *)((long)*pauVar87 + 0x1c) + fVar33 + fVar34 + fVar101 +
                       fVar102 + fVar103 + fVar103 + fVar48 + fVar48 + fVar49 + fVar48 + fVar48 +
                       fVar107 + fVar56 + fVar107 + fVar56 + fVar57;
                  *pauVar87 = auVar98;
                  pauVar87 = pauVar87 + 1;
                  iVar89 = iVar89 + -1;
                  pfVar92 = pfVar91;
                } while (iVar89 != 0);
              }
              pfVar88 = pfVar88 + 8;
              pfVar91 = pfVar91 + 8;
              iVar83 = iVar83 + 1;
            } while (iVar83 != iVar78);
          }
          uVar85 = uVar85 + 1;
        } while (uVar85 != uVar79);
      }
      lVar95 = lVar95 + 1;
    } while (lVar95 != iVar76);
  }
  return;
}

Assistant:

static void conv2x2s1_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + p * 8) : _mm256_set1_ps(0.f);
        out0.fill(_bias0);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);

            const float* kptr = (const float*)kernel.channel(p).row(q);
            // const float* kptr = (const float*)kernel + 4 * inch * p * 64;

            int i = 0;
            for (; i < outh; i++)
            {
                int j = 0;

                for (; j + 1 < outw; j += 2)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);
                    __m256 _sum1 = _mm256_loadu_ps(outptr0 + 8);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    __m256 _k00 = _mm256_loadu_ps(kptr);
                    __m256 _k01 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k02 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    __m256 _k04 = _mm256_loadu_ps(kptr);
                    __m256 _k05 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k06 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    //========================================

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);

                    _k00 = _mm256_loadu_ps(kptr);
                    _k01 = _mm256_loadu_ps(kptr + 8);
                    _k02 = _mm256_loadu_ps(kptr + 16);
                    _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    _k04 = _mm256_loadu_ps(kptr);
                    _k05 = _mm256_loadu_ps(kptr + 8);
                    _k06 = _mm256_loadu_ps(kptr + 16);
                    _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = _mm256_loadu_ps(kptr);
                    __m256 _k11 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k12 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    __m256 _k14 = _mm256_loadu_ps(kptr);
                    __m256 _k15 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k16 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k17 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    _k10 = _mm256_loadu_ps(kptr);
                    _k11 = _mm256_loadu_ps(kptr + 8);
                    _k12 = _mm256_loadu_ps(kptr + 16);
                    _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    _k14 = _mm256_loadu_ps(kptr);
                    _k15 = _mm256_loadu_ps(kptr + 8);
                    _k16 = _mm256_loadu_ps(kptr + 16);
                    _k17 = _mm256_loadu_ps(kptr + 24);
                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum0);
                    _mm256_storeu_ps(outptr0 + 8, _sum1);
                    outptr0 += 16;
                }

                for (; j < outw; j++)
                {
                    __m256 _sum = _mm256_loadu_ps(outptr0);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);

                    __m256 _k00 = _mm256_loadu_ps(kptr);
                    __m256 _k01 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k02 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    __m256 _k04 = _mm256_loadu_ps(kptr);
                    __m256 _k05 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k06 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);

                    //========================================
                    r0 += 8;
                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _k00 = _mm256_loadu_ps(kptr);
                    _k01 = _mm256_loadu_ps(kptr + 8);
                    _k02 = _mm256_loadu_ps(kptr + 16);
                    _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    _k04 = _mm256_loadu_ps(kptr);
                    _k05 = _mm256_loadu_ps(kptr + 8);
                    _k06 = _mm256_loadu_ps(kptr + 16);
                    _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = _mm256_loadu_ps(kptr);
                    __m256 _k11 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k12 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    __m256 _k14 = _mm256_loadu_ps(kptr);
                    __m256 _k15 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k16 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k17 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _k10 = _mm256_loadu_ps(kptr);
                    _k11 = _mm256_loadu_ps(kptr + 8);
                    _k12 = _mm256_loadu_ps(kptr + 16);
                    _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    _k14 = _mm256_loadu_ps(kptr);
                    _k15 = _mm256_loadu_ps(kptr + 8);
                    _k16 = _mm256_loadu_ps(kptr + 16);
                    _k17 = _mm256_loadu_ps(kptr + 24);
                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum);
                    outptr0 += 8;
                }

                r0 += 8;
                r1 += 8;
            }
        }
    }
}